

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O2

void __thiscall raptor::TcpServer::OnConnectionClosed(TcpServer *this,ConnectionId cid)

{
  TcpMessageNode *this_00;
  
  this_00 = (TcpMessageNode *)operator_new(0x58);
  TcpMessageNode::TcpMessageNode(this_00);
  this_00->cid = cid;
  this_00->type = kCloseClient;
  MultiProducerSingleConsumerQueue::push(&this->_mpscq,(Node *)this_00);
  LOCK();
  (this->_count)._value.super___atomic_base<unsigned_int>._M_i =
       (this->_count)._value.super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  pthread_cond_signal((pthread_cond_t *)&this->_cv);
  return;
}

Assistant:

void TcpServer::OnConnectionClosed(ConnectionId cid) {
    TcpMessageNode* msg = new TcpMessageNode;
    msg->cid = cid;
    msg->type = MessageType::kCloseClient;
    _mpscq.push(&msg->node);
    _count.FetchAdd(1, MemoryOrder::ACQ_REL);
    _cv.Signal();
}